

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

void testing::internal::
     UniversalPrinter<std::optional<std::basic_string_view<char,_std::char_traits<char>_>_>_>::Print
               (Optional<std::basic_string_view<char>_> *value,ostream *os)

{
  bool bVar1;
  basic_string_view<char,_std::char_traits<char>_> *value_00;
  ostream *os_local;
  Optional<std::basic_string_view<char>_> *value_local;
  
  std::operator<<(os,'(');
  bVar1 = std::optional::operator_cast_to_bool((optional *)value);
  if (bVar1) {
    value_00 = std::optional<std::basic_string_view<char,_std::char_traits<char>_>_>::operator*
                         (value);
    UniversalPrint<std::basic_string_view<char,std::char_traits<char>>>(value_00,os);
  }
  else {
    std::operator<<(os,"nullopt");
  }
  std::operator<<(os,')');
  return;
}

Assistant:

static void Print(const Optional<T>& value, ::std::ostream* os) {
    *os << '(';
    if (!value) {
      *os << "nullopt";
    } else {
      UniversalPrint(*value, os);
    }
    *os << ')';
  }